

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dmemory.c
# Opt level: O3

double * doubleCalloc(size_t n)

{
  double *__s;
  char msg [256];
  char acStack_128 [264];
  
  __s = (double *)superlu_malloc(n * 8);
  if (__s == (double *)0x0) {
    sprintf(acStack_128,"%s at line %d in file %s\n",
            "SUPERLU_MALLOC failed for buf in doubleCalloc()\n",0x2c2,
            "/workspace/llm4binary/github/license_c_cmakelists/xiaoyeli[P]superlu/SRC/dmemory.c");
    superlu_abort_and_exit(acStack_128);
  }
  if (n != 0) {
    memset(__s,0,n * 8);
  }
  return __s;
}

Assistant:

double *doubleCalloc(size_t n)
{
    double *buf;
    register size_t i;
    double zero = 0.0;
    buf = (double *) SUPERLU_MALLOC(n * (size_t) sizeof(double));
    if ( !buf ) {
	ABORT("SUPERLU_MALLOC failed for buf in doubleCalloc()\n");
    }
    for (i = 0; i < n; ++i) buf[i] = zero;
    return (buf);
}